

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1EnforceMaxPage(PGroup *pGroup)

{
  long in_RDI;
  bool bVar1;
  PgHdr1 *p;
  PgHdr1 *pPage;
  
  while( true ) {
    bVar1 = false;
    if (*(uint *)(in_RDI + 8) < *(uint *)(in_RDI + 0x14)) {
      bVar1 = *(long *)(in_RDI + 0x20) != 0;
    }
    if (!bVar1) break;
    pPage = *(PgHdr1 **)(in_RDI + 0x20);
    pcache1PinPage(pPage);
    pcache1RemoveFromHash(pPage);
    pcache1FreePage(pPage);
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PGroup *pGroup){
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nCurrentPage>pGroup->nMaxPage && pGroup->pLruTail ){
    PgHdr1 *p = pGroup->pLruTail;
    assert( p->pCache->pGroup==pGroup );
    assert( p->isPinned==0 );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p);
    pcache1FreePage(p);
  }
}